

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.h
# Opt level: O1

QPixmap * __thiscall QPixmap::operator=(QPixmap *this,QPixmap *other)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  code *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_38);
  local_38 = QDataStream::operator<<;
  uVar1 = *(undefined8 *)(other + 0x10);
  *(undefined8 *)(other + 0x10) = 0;
  local_28 = *(undefined1 **)(this + 0x10);
  *(undefined8 *)(this + 0x10) = uVar1;
  QPixmap::~QPixmap((QPixmap *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline void swap(QPixmap &other) noexcept
    { data.swap(other.data); }